

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigFilter.cpp
# Opt level: O1

bool __thiscall eglu::FilterList::match(FilterList *this,ConfigInfo *configInfo)

{
  char cVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined4 local_40 [2];
  ConfigInfo *local_38;
  
  local_40[0] = 1;
  puVar2 = *(undefined8 **)this;
  bVar3 = puVar2 == *(undefined8 **)(this + 8);
  if ((!bVar3) && (local_38 = configInfo, cVar1 = (*(code *)*puVar2)(local_40), cVar1 != '\0')) {
    do {
      puVar2 = puVar2 + 1;
      bVar3 = puVar2 == *(undefined8 **)(this + 8);
      if (bVar3) {
        return bVar3;
      }
      cVar1 = (*(code *)*puVar2)(local_40);
    } while (cVar1 != '\0');
  }
  return bVar3;
}

Assistant:

CandidateConfig::CandidateConfig (const ConfigInfo& configInfo)
	: m_type(TYPE_CONFIG_INFO)
{
	m_cfg.configInfo = &configInfo;
}